

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  char *pcVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  XmlWriter *this_00;
  string local_68;
  string local_48;
  
  Option<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>);
  pcVar1 = (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
           storage;
  *(char **)(this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
            storage =
       (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.storage +
       0x10;
  pcVar2 = (groupInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pcVar1,pcVar2,pcVar2 + (groupInfo->name)._M_string_length);
  uVar3 = *(undefined4 *)((long)&groupInfo->groupIndex + 4);
  sVar5 = groupInfo->groupsCounts;
  uVar4 = *(undefined4 *)((long)&groupInfo->groupsCounts + 4);
  *(int *)((this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
           storage + 0x20) = (int)groupInfo->groupIndex;
  *(undefined4 *)
   ((this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.storage +
   0x24) = uVar3;
  *(int *)((this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
           storage + 0x28) = (int)sVar5;
  *(undefined4 *)
   ((this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.storage +
   0x2c) = uVar4;
  (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.nullableValue
       = (GroupInfo *)pcVar1;
  (this->super_StreamingReporterBase).currentGroupInfo.used = false;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Group","");
  this_00 = XmlWriter::startElement(&this->m_xml,&local_68);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"name","");
  XmlWriter::writeAttribute(this_00,&local_48,&groupInfo->name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testGroupStarting( groupInfo );
            m_xml.startElement( "Group" )
                .writeAttribute( "name", groupInfo.name );
        }